

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O3

void spell_interference(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  AREA_DATA_conflict *area;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  AREA_AFFECT_DATA aaf;
  AFFECT_DATA af;
  char buf [4608];
  AREA_AFFECT_DATA local_12f0;
  AFFECT_DATA local_12a0;
  char local_1238 [4616];
  
  area = ch->in_room->area;
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    pcVar3 = "You cannot conjure more electrical interference yet.\n\r";
  }
  else {
    bVar1 = is_affected_area(area,(int)gsn_interference);
    if (!bVar1) {
      init_affect_area(&local_12f0);
      local_12f0.where = 0;
      local_12f0.type = gsn_interference;
      local_12f0.aftype = 0;
      local_12f0.level = (short)level;
      iVar2 = dice(2,3);
      local_12f0.duration = (short)iVar2 + 5;
      local_12f0.location = 0;
      local_12f0.modifier = 0;
      local_12f0.tick_fun = (AAFF_FUN *)0x0;
      local_12f0.end_fun = interference_end;
      local_12f0.owner = ch;
      affect_to_area(area,&local_12f0);
      init_affect(&local_12a0);
      local_12a0.where = 0;
      local_12a0.type = gsn_interference;
      local_12a0.aftype = 7;
      local_12a0.duration = 0x30;
      local_12a0.location = 0;
      local_12a0.modifier = 0;
      local_12a0.owner = ch;
      affect_to_char(ch,&local_12a0);
      send_to_char("You blanket the area with a veil of electrical interference.\n\r",ch);
      pcVar3 = "air";
      if (ch->in_room->sector_type == 8) {
        pcVar3 = "water";
      }
      snprintf(local_1238,0x1200,
               "{yA smell of ozone fills the %s as electricity crackles around you.{x",pcVar3);
      rarea_echo(ch->in_room,local_1238);
      return;
    }
    pcVar3 = "This area is already blanketed by a veil of electrical interference.\n\r";
  }
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void spell_interference(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AREA_AFFECT_DATA aaf;
	AREA_DATA *area;
	AFFECT_DATA af;
	char buf[MAX_STRING_LENGTH];

	area = ch->in_room->area;

	if (is_affected(ch, sn))
	{
		send_to_char("You cannot conjure more electrical interference yet.\n\r", ch);
		return;
	}

	if (is_affected_area(area, gsn_interference))
	{
		send_to_char("This area is already blanketed by a veil of electrical interference.\n\r", ch);
		return;
	}

	init_affect_area(&aaf);
	aaf.where = TO_ROOM_AFFECTS;
	aaf.type = gsn_interference;
	aaf.aftype = AFT_SPELL;
	aaf.level = level;
	aaf.duration = dice(2, 3) + 5;
	aaf.location = 0;
	aaf.modifier = 0;
	aaf.owner = ch;
	aaf.tick_fun = nullptr;
	aaf.end_fun = interference_end;
	affect_to_area(area, &aaf);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_interference;
	af.aftype = AFT_TIMER;
	af.duration = 48;
	af.location = 0;
	af.modifier = 0;
	af.owner = ch;
	affect_to_char(ch, &af);

	send_to_char("You blanket the area with a veil of electrical interference.\n\r", ch);
	std::snprintf(buf, static_cast<int>(MSL), "{yA smell of ozone fills the %s as electricity crackles around you.{x",
		ch->in_room->sector_type == SECT_UNDERWATER ? "water" : "air");

	rarea_echo(ch->in_room, buf);
}